

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pda.cpp
# Opt level: O2

bool __thiscall
Pda::checkIfDouble(Pda *this,vector<Tjen::Node_*,_std::allocator<Tjen::Node_*>_> *v,Node *n)

{
  pointer ppNVar1;
  Node *this_00;
  bool bVar2;
  __type _Var3;
  string *__lhs;
  string *__rhs;
  pointer ppNVar4;
  _Deque_base<char,_std::allocator<char>_> local_d0;
  _Deque_base<char,_std::allocator<char>_> local_80;
  
  ppNVar1 = (v->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar4 = (v->super__Vector_base<Tjen::Node_*,_std::allocator<Tjen::Node_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; ppNVar4 != ppNVar1; ppNVar4 = ppNVar4 + 1) {
    this_00 = *ppNVar4;
    Tjen::Node::getStack((stack<char,_std::deque<char,_std::allocator<char>_>_> *)&local_80,this_00)
    ;
    Tjen::Node::getStack((stack<char,_std::deque<char,_std::allocator<char>_>_> *)&local_d0,n);
    bVar2 = std::operator==((deque<char,_std::allocator<char>_> *)&local_80,
                            (deque<char,_std::allocator<char>_> *)&local_d0);
    if (bVar2) {
      __lhs = Tjen::Node::getName_abi_cxx11_(this_00);
      __rhs = Tjen::Node::getName_abi_cxx11_(n);
      _Var3 = std::operator==(__lhs,__rhs);
      std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_d0);
      std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_80);
      if (_Var3) break;
    }
    else {
      std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_d0);
      std::_Deque_base<char,_std::allocator<char>_>::~_Deque_base(&local_80);
    }
  }
  return ppNVar4 != ppNVar1;
}

Assistant:

bool Pda::checkIfDouble(std::vector<Tjen::Node *> &v, Tjen::Node *n) {
    for(Tjen::Node* state : v){
        if(state->getStack() == n->getStack() && state->getName() == n->getName()){
            return true;
        }

    }
        return false;
}